

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalNinjaGenerator::WriteBuild
          (cmGlobalNinjaGenerator *this,ostream *os,cmNinjaBuild *build,int cmdLineLimit,
          bool *usedResponseFile)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmGlobalNinjaGenerator *pcVar3;
  pointer pbVar4;
  undefined8 uVar5;
  bool bVar6;
  long *plVar7;
  _Base_ptr p_Var8;
  ostream *poVar9;
  cmGlobalNinjaGenerator *pcVar10;
  string *explicitDep;
  pointer pbVar11;
  undefined1 auVar12 [8];
  char *pcVar13;
  string *output;
  cmGlobalNinjaGenerator *pcVar14;
  char *__end;
  string assignments;
  string arguments;
  string buildStr;
  ostringstream variable_assignments;
  string local_268;
  string local_248;
  string local_228;
  cmGlobalNinjaGenerator *local_208;
  long local_200;
  undefined1 local_1f8 [48];
  string local_1c8;
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  undefined1 local_198 [96];
  ios_base local_138 [264];
  
  if ((build->Rule)._M_string_length == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "No rule for WriteBuild! called with comment: ",&build->Comment);
    cmSystemTools::Error
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  }
  else {
    if ((build->Outputs).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (build->Outputs).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_1f8._16_8_ = usedResponseFile;
      local_1f8._24_8_ = os;
      local_1f8._36_4_ = cmdLineLimit;
      WriteComment(os,&build->Comment);
      local_208 = (cmGlobalNinjaGenerator *)local_1f8;
      auVar12 = (undefined1  [8])0x52e0d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"build","");
      pcVar14 = (cmGlobalNinjaGenerator *)
                (build->Outputs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar3 = (cmGlobalNinjaGenerator *)
               (build->Outputs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pcVar14 != pcVar3) {
        local_1f8._40_8_ = &this->CombinedBuildOutputs;
        do {
          EncodePath(&local_248,(cmGlobalNinjaGenerator *)auVar12,(string *)pcVar14);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,0x52c1bf);
          pcVar10 = (cmGlobalNinjaGenerator *)(plVar7 + 2);
          if ((cmGlobalNinjaGenerator *)*plVar7 == pcVar10) {
            local_198._0_8_ =
                 (pcVar10->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                 _vptr_cmGlobalGenerator;
            local_198._8_8_ = plVar7[3];
            local_1a8 = (undefined1  [8])local_198;
          }
          else {
            local_198._0_8_ =
                 (pcVar10->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                 _vptr_cmGlobalGenerator;
            local_1a8 = (undefined1  [8])*plVar7;
          }
          local_1a0._M_p = (pointer)plVar7[1];
          *plVar7 = (long)pcVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          auVar12 = local_1a8;
          std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_1a8);
          if (local_1a8 != (undefined1  [8])local_198) {
            auVar12 = (undefined1  [8])(local_198._0_8_ + 1);
            operator_delete((void *)local_1a8,(ulong)auVar12);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            auVar12 = (undefined1  [8])
                      (CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                local_248.field_2._M_local_buf[0]) + 1);
            operator_delete(local_248._M_dataplus._M_p,(ulong)auVar12);
          }
          if (this->ComputingUnknownDependencies == true) {
            auVar12 = (undefined1  [8])pcVar14;
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_1f8._40_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar14)
            ;
          }
          pcVar14 = (cmGlobalNinjaGenerator *)
                    &(pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.MakeSilentFlag
                     .field_2;
        } while (pcVar14 != pcVar3);
      }
      if ((build->ImplicitOuts).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (build->ImplicitOuts).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar13 = " |";
        std::__cxx11::string::append((char *)&local_208);
        pbVar11 = (build->ImplicitOuts).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = (build->ImplicitOuts).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar11 != pbVar4) {
          do {
            EncodePath(&local_248,(cmGlobalNinjaGenerator *)pcVar13,pbVar11);
            plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,0x52c1bf)
            ;
            pcVar14 = (cmGlobalNinjaGenerator *)(plVar7 + 2);
            if ((cmGlobalNinjaGenerator *)*plVar7 == pcVar14) {
              local_198._0_8_ =
                   (pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                   _vptr_cmGlobalGenerator;
              local_198._8_8_ = plVar7[3];
              local_1a8 = (undefined1  [8])local_198;
            }
            else {
              local_198._0_8_ =
                   (pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                   _vptr_cmGlobalGenerator;
              local_1a8 = (undefined1  [8])*plVar7;
            }
            local_1a0._M_p = (pointer)plVar7[1];
            *plVar7 = (long)pcVar14;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            pcVar13 = (char *)local_1a8;
            std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_1a8);
            if (local_1a8 != (undefined1  [8])local_198) {
              pcVar13 = (char *)(local_198._0_8_ + 1);
              operator_delete((void *)local_1a8,(ulong)pcVar13);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              pcVar13 = (char *)(CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                          local_248.field_2._M_local_buf[0]) + 1);
              operator_delete(local_248._M_dataplus._M_p,(ulong)pcVar13);
            }
            pbVar11 = pbVar11 + 1;
          } while (pbVar11 != pbVar4);
        }
      }
      std::__cxx11::string::append((char *)&local_208);
      std::__cxx11::string::append((char *)&local_208);
      auVar12 = (undefined1  [8])(build->Rule)._M_dataplus._M_p;
      std::__cxx11::string::_M_append((char *)&local_208,(ulong)auVar12);
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      local_248._M_string_length = 0;
      local_248.field_2._M_local_buf[0] = '\0';
      pbVar11 = (build->ExplicitDeps).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (build->ExplicitDeps).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar11 != pbVar4) {
        do {
          EncodePath(&local_268,(cmGlobalNinjaGenerator *)auVar12,pbVar11);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,0x52c1bf);
          pcVar14 = (cmGlobalNinjaGenerator *)(plVar7 + 2);
          if ((cmGlobalNinjaGenerator *)*plVar7 == pcVar14) {
            local_198._0_8_ =
                 (pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                 _vptr_cmGlobalGenerator;
            local_198._8_8_ = plVar7[3];
            local_1a8 = (undefined1  [8])local_198;
          }
          else {
            local_198._0_8_ =
                 (pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                 _vptr_cmGlobalGenerator;
            local_1a8 = (undefined1  [8])*plVar7;
          }
          local_1a0._M_p = (pointer)plVar7[1];
          *plVar7 = (long)pcVar14;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          auVar12 = local_1a8;
          std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1a8);
          if (local_1a8 != (undefined1  [8])local_198) {
            auVar12 = (undefined1  [8])(local_198._0_8_ + 1);
            operator_delete((void *)local_1a8,(ulong)auVar12);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            auVar12 = (undefined1  [8])
                      (CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                local_268.field_2._M_local_buf[0]) + 1);
            operator_delete(local_268._M_dataplus._M_p,(ulong)auVar12);
          }
          pbVar11 = pbVar11 + 1;
        } while (pbVar11 != pbVar4);
      }
      if ((build->ImplicitDeps).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (build->ImplicitDeps).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar13 = " |";
        std::__cxx11::string::append((char *)&local_248);
        pbVar11 = (build->ImplicitDeps).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = (build->ImplicitDeps).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar11 != pbVar4) {
          do {
            EncodePath(&local_268,(cmGlobalNinjaGenerator *)pcVar13,pbVar11);
            plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,0x52c1bf)
            ;
            pcVar14 = (cmGlobalNinjaGenerator *)(plVar7 + 2);
            if ((cmGlobalNinjaGenerator *)*plVar7 == pcVar14) {
              local_198._0_8_ =
                   (pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                   _vptr_cmGlobalGenerator;
              local_198._8_8_ = plVar7[3];
              local_1a8 = (undefined1  [8])local_198;
            }
            else {
              local_198._0_8_ =
                   (pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                   _vptr_cmGlobalGenerator;
              local_1a8 = (undefined1  [8])*plVar7;
            }
            local_1a0._M_p = (pointer)plVar7[1];
            *plVar7 = (long)pcVar14;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            pcVar13 = (char *)local_1a8;
            std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1a8);
            if (local_1a8 != (undefined1  [8])local_198) {
              pcVar13 = (char *)(local_198._0_8_ + 1);
              operator_delete((void *)local_1a8,(ulong)pcVar13);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              pcVar13 = (char *)(CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                          local_268.field_2._M_local_buf[0]) + 1);
              operator_delete(local_268._M_dataplus._M_p,(ulong)pcVar13);
            }
            pbVar11 = pbVar11 + 1;
          } while (pbVar11 != pbVar4);
        }
      }
      if ((build->OrderOnlyDeps).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (build->OrderOnlyDeps).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar13 = " ||";
        std::__cxx11::string::append((char *)&local_248);
        pbVar11 = (build->OrderOnlyDeps).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = (build->OrderOnlyDeps).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar11 != pbVar4) {
          do {
            EncodePath(&local_268,(cmGlobalNinjaGenerator *)pcVar13,pbVar11);
            plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,0x52c1bf)
            ;
            pcVar14 = (cmGlobalNinjaGenerator *)(plVar7 + 2);
            if ((cmGlobalNinjaGenerator *)*plVar7 == pcVar14) {
              local_198._0_8_ =
                   (pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                   _vptr_cmGlobalGenerator;
              local_198._8_8_ = plVar7[3];
              local_1a8 = (undefined1  [8])local_198;
            }
            else {
              local_198._0_8_ =
                   (pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                   _vptr_cmGlobalGenerator;
              local_1a8 = (undefined1  [8])*plVar7;
            }
            local_1a0._M_p = (pointer)plVar7[1];
            *plVar7 = (long)pcVar14;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            pcVar13 = (char *)local_1a8;
            std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1a8);
            if (local_1a8 != (undefined1  [8])local_198) {
              pcVar13 = (char *)(local_198._0_8_ + 1);
              operator_delete((void *)local_1a8,(ulong)pcVar13);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              pcVar13 = (char *)(CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                          local_268.field_2._M_local_buf[0]) + 1);
              operator_delete(local_268._M_dataplus._M_p,(ulong)pcVar13);
            }
            pbVar11 = pbVar11 + 1;
          } while (pbVar11 != pbVar4);
        }
      }
      std::__cxx11::string::append((char *)&local_248);
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      local_268._M_string_length = 0;
      local_268.field_2._M_local_buf[0] = '\0';
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      p_Var8 = (build->Variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(build->Variables)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var8 != p_Var1) {
        do {
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"","");
          WriteVariable((ostream *)local_1a8,(string *)(p_Var8 + 1),(string *)(p_Var8 + 2),
                        &local_228,1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,
                            CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                     local_228.field_2._M_local_buf[0]) + 1);
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != p_Var1);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&local_268,(string *)&local_228);
      paVar2 = &local_228.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar2) {
        operator_delete(local_228._M_dataplus._M_p,
                        CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                 local_228.field_2._M_local_buf[0]) + 1);
      }
      if (((int)local_1f8._36_4_ < 0) ||
         ((local_1f8._36_4_ != 0 &&
          ((ulong)(uint)local_1f8._36_4_ <
           local_248._M_string_length + local_200 + local_268._M_string_length + 1000)))) {
        local_228._M_string_length = 0;
        local_228.field_2._M_local_buf[0] = '\0';
        local_228._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::stringbuf::str((string *)&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar2) {
          operator_delete(local_228._M_dataplus._M_p,
                          CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                   local_228.field_2._M_local_buf[0]) + 1);
        }
        local_228._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"RSP_FILE","");
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
        WriteVariable((ostream *)local_1a8,&local_228,&build->RspFile,&local_1c8,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar2) {
          operator_delete(local_228._M_dataplus._M_p,
                          CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                   local_228.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_228._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar2) {
          operator_delete(local_228._M_dataplus._M_p,
                          CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                   local_228.field_2._M_local_buf[0]) + 1);
        }
        bVar6 = true;
      }
      else {
        bVar6 = false;
      }
      uVar5 = local_1f8._24_8_;
      if ((bool *)local_1f8._16_8_ != (bool *)0x0) {
        *(bool *)local_1f8._16_8_ = bVar6;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)uVar5,(char *)local_208,local_200);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_248._M_dataplus._M_p,local_248._M_string_length);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_268._M_dataplus._M_p,local_268._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,
                        CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                 local_268.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                 local_248.field_2._M_local_buf[0]) + 1);
      }
      auVar12 = (undefined1  [8])local_208;
      if (local_208 == (cmGlobalNinjaGenerator *)local_1f8) {
        return;
      }
      goto LAB_0025ff93;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "No output files for WriteBuild! called with comment: ",&build->Comment);
    cmSystemTools::Error
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  }
  local_1f8._0_8_ = local_198._0_8_;
  auVar12 = local_1a8;
  if (local_1a8 == (undefined1  [8])local_198) {
    return;
  }
LAB_0025ff93:
  operator_delete((void *)auVar12,local_1f8._0_8_ + 1);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteBuild(std::ostream& os,
                                        cmNinjaBuild const& build,
                                        int cmdLineLimit,
                                        bool* usedResponseFile)
{
  // Make sure there is a rule.
  if (build.Rule.empty()) {
    cmSystemTools::Error("No rule for WriteBuild! called with comment: " +
                         build.Comment);
    return;
  }

  // Make sure there is at least one output file.
  if (build.Outputs.empty()) {
    cmSystemTools::Error(
      "No output files for WriteBuild! called with comment: " + build.Comment);
    return;
  }

  cmGlobalNinjaGenerator::WriteComment(os, build.Comment);

  // Write output files.
  std::string buildStr("build");
  {
    // Write explicit outputs
    for (std::string const& output : build.Outputs) {
      buildStr += " " + EncodePath(output);
      if (this->ComputingUnknownDependencies) {
        this->CombinedBuildOutputs.insert(output);
      }
    }
    // Write implicit outputs
    if (!build.ImplicitOuts.empty()) {
      buildStr += " |";
      for (std::string const& implicitOut : build.ImplicitOuts) {
        buildStr += " " + EncodePath(implicitOut);
      }
    }
    buildStr += ":";

    // Write the rule.
    buildStr += " ";
    buildStr += build.Rule;
  }

  std::string arguments;
  {
    // TODO: Better formatting for when there are multiple input/output files.

    // Write explicit dependencies.
    for (std::string const& explicitDep : build.ExplicitDeps) {
      arguments += " " + EncodePath(explicitDep);
    }

    // Write implicit dependencies.
    if (!build.ImplicitDeps.empty()) {
      arguments += " |";
      for (std::string const& implicitDep : build.ImplicitDeps) {
        arguments += " " + EncodePath(implicitDep);
      }
    }

    // Write order-only dependencies.
    if (!build.OrderOnlyDeps.empty()) {
      arguments += " ||";
      for (std::string const& orderOnlyDep : build.OrderOnlyDeps) {
        arguments += " " + EncodePath(orderOnlyDep);
      }
    }

    arguments += "\n";
  }

  // Write the variables bound to this build statement.
  std::string assignments;
  {
    std::ostringstream variable_assignments;
    for (auto const& variable : build.Variables) {
      cmGlobalNinjaGenerator::WriteVariable(
        variable_assignments, variable.first, variable.second, "", 1);
    }

    // check if a response file rule should be used
    assignments = variable_assignments.str();
    bool useResponseFile = false;
    if (cmdLineLimit < 0 ||
        (cmdLineLimit > 0 &&
         (arguments.size() + buildStr.size() + assignments.size() + 1000) >
           static_cast<size_t>(cmdLineLimit))) {
      variable_assignments.str(std::string());
      cmGlobalNinjaGenerator::WriteVariable(variable_assignments, "RSP_FILE",
                                            build.RspFile, "", 1);
      assignments += variable_assignments.str();
      useResponseFile = true;
    }
    if (usedResponseFile) {
      *usedResponseFile = useResponseFile;
    }
  }

  os << buildStr << arguments << assignments << "\n";
}